

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

aiMesh * __thiscall
Assimp::ColladaLoader::CreateMesh
          (ColladaLoader *this,ColladaParser *pParser,Mesh *pSrcMesh,SubMesh *pSubMesh,
          Controller *pSrcController,size_t pStartVertex,size_t pStartFace)

{
  AccessorLibrary *pLibrary;
  DataLibrary *pLibrary_00;
  map<Assimp::BaseImporter::ImporterUnits,_double,_std::less<Assimp::BaseImporter::ImporterUnits>,_std::allocator<std::pair<const_Assimp::BaseImporter::ImporterUnits,_double>_>_>
  *pmVar1;
  MeshLibrary *pLibrary_01;
  pointer *pppaVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  pointer paVar22;
  SubMesh *pSVar23;
  iterator __position;
  ColladaLoader *pCVar24;
  ColladaLoader *pCVar25;
  pointer puVar26;
  unsigned_long uVar27;
  size_t sVar28;
  iterator __position_00;
  void *__src;
  bool bVar29;
  undefined1 auVar30 [16];
  _Head_base<0UL,_aiMesh_*,_false> _Var31;
  pointer pvVar32;
  aiVertexWeight aVar33;
  int iVar34;
  aiMesh *paVar35;
  aiVector3D *paVar36;
  ulong uVar37;
  aiColor4D *paVar38;
  ulong *puVar39;
  aiFace *paVar40;
  uint *puVar41;
  ulong uVar42;
  Mesh **ppMVar43;
  Accessor *pAVar44;
  Accessor *pAVar45;
  Data *pDVar46;
  Data *pDVar47;
  pointer pbVar48;
  pointer pfVar49;
  _Rb_tree_node_base *p_Var50;
  aiMesh *paVar51;
  aiAnimMesh **ppaVar52;
  Accessor *pAVar53;
  pointer ppVar54;
  aiBone **ppaVar55;
  aiBone *paVar56;
  string *psVar57;
  aiVertexWeight *__s;
  Node *pNVar58;
  Logger *this_00;
  runtime_error *prVar59;
  aiFace *paVar60;
  long lVar61;
  long lVar62;
  size_t sVar63;
  uint uVar64;
  ulong uVar65;
  Controller *pCVar66;
  long lVar67;
  ColladaParser *pCVar68;
  ColladaLoader *pCVar69;
  size_t *psVar70;
  size_t real;
  Mesh *pMVar71;
  _Rb_tree_node_base *p_Var72;
  unsigned_long uVar73;
  uint uVar74;
  float fVar75;
  ai_real aVar76;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> targetMeshes;
  vector<float,_std::allocator<float>_> targetWeights;
  aiMesh *aimesh;
  vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
  dstBones;
  vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
  weightStartPerVertex;
  vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> animMeshes;
  _Head_base<0UL,_aiMesh_*,_false> local_310;
  ColladaLoader *local_308;
  Mesh *local_300;
  Accessor *local_2f8;
  ColladaLoader *local_2f0;
  ulong local_2e8;
  size_t local_2e0;
  ColladaParser *local_2d8;
  Controller *local_2d0;
  SubMesh *local_2c8;
  ColladaLoader *local_2c0;
  _Rb_tree_node_base *local_2b8;
  float local_2ac;
  float local_2a8;
  float local_2a4;
  float local_2a0;
  float local_29c;
  aiMesh **local_298;
  iterator iStack_290;
  aiMesh **local_288;
  void *local_278;
  iterator iStack_270;
  float *local_268;
  Data *local_260;
  aiColor4D *local_258;
  aiMesh *local_250 [2];
  undefined1 local_240 [20];
  float local_22c;
  float local_228;
  float local_224;
  float local_220;
  float local_21c;
  float local_218;
  float local_214;
  float local_210;
  float local_20c;
  Data *local_208;
  aiColor4D *local_200;
  aiColor4D *local_1f8;
  vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
  local_1f0;
  undefined1 local_1d8 [16];
  aiVector3D *local_1c8;
  Accessor *local_1b8;
  Accessor *local_1b0;
  undefined1 local_1a8 [8];
  aiVertexWeight aStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_2e0 = pStartVertex;
  local_2d8 = pParser;
  local_2d0 = pSrcController;
  local_2c0 = this;
  paVar35 = (aiMesh *)operator_new(0x520);
  paVar35->mPrimitiveTypes = 0;
  paVar35->mNumVertices = 0;
  paVar35->mNumFaces = 0;
  local_300 = (Mesh *)&paVar35->mVertices;
  memset(local_300,0,0xcc);
  paVar35->mBones = (aiBone **)0x0;
  paVar35->mMaterialIndex = 0;
  (paVar35->mName).length = 0;
  (paVar35->mName).data[0] = '\0';
  memset((paVar35->mName).data + 1,0x1b,0x3ff);
  paVar35->mNumAnimMeshes = 0;
  paVar35->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar35->mMethod = 0;
  (paVar35->mAABB).mMin.x = 0.0;
  (paVar35->mAABB).mMin.y = 0.0;
  (paVar35->mAABB).mMin.z = 0.0;
  (paVar35->mAABB).mMax.x = 0.0;
  (paVar35->mAABB).mMax.y = 0.0;
  (paVar35->mAABB).mMax.z = 0.0;
  paVar35->mTextureCoords[0] = (aiVector3D *)0x0;
  paVar35->mTextureCoords[1] = (aiVector3D *)0x0;
  paVar35->mTextureCoords[2] = (aiVector3D *)0x0;
  paVar35->mTextureCoords[3] = (aiVector3D *)0x0;
  paVar35->mTextureCoords[4] = (aiVector3D *)0x0;
  paVar35->mTextureCoords[5] = (aiVector3D *)0x0;
  paVar35->mTextureCoords[6] = (aiVector3D *)0x0;
  paVar35->mTextureCoords[7] = (aiVector3D *)0x0;
  paVar35->mNumUVComponents[0] = 0;
  paVar35->mNumUVComponents[1] = 0;
  paVar35->mNumUVComponents[2] = 0;
  paVar35->mNumUVComponents[3] = 0;
  paVar35->mNumUVComponents[4] = 0;
  paVar35->mNumUVComponents[5] = 0;
  paVar35->mNumUVComponents[6] = 0;
  paVar35->mNumUVComponents[7] = 0;
  paVar35->mColors[0] = (aiColor4D *)0x0;
  paVar35->mColors[1] = (aiColor4D *)0x0;
  paVar35->mColors[2] = (aiColor4D *)0x0;
  paVar35->mColors[3] = (aiColor4D *)0x0;
  paVar35->mColors[4] = (aiColor4D *)0x0;
  paVar35->mColors[5] = (aiColor4D *)0x0;
  paVar35->mColors[6] = (aiColor4D *)0x0;
  paVar35->mColors[7] = (aiColor4D *)0x0;
  uVar37 = (pSrcMesh->mName)._M_string_length;
  local_310._M_head_impl = paVar35;
  if (uVar37 < 0x400) {
    (paVar35->mName).length = (ai_uint32)uVar37;
    memcpy((paVar35->mName).data,(pSrcMesh->mName)._M_dataplus._M_p,uVar37);
    (paVar35->mName).data[uVar37] = '\0';
  }
  sVar28 = local_2e0;
  if (pSubMesh->mNumFaces == 0) {
    pAVar44 = (Accessor *)0x0;
  }
  else {
    lVar61 = 0;
    pAVar44 = (Accessor *)0x0;
    do {
      pAVar44 = (Accessor *)
                ((long)pAVar44->mSubOffset +
                *(long *)((long)(pSrcMesh->mFaceSize).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar61 + pStartFace * 8)
                + -0x38);
      lVar61 = lVar61 + 8;
    } while (pSubMesh->mNumFaces << 3 != lVar61);
  }
  paVar35->mNumVertices = (uint)pAVar44;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = pAVar44;
  local_308 = (ColladaLoader *)0xffffffffffffffff;
  if (SUB168(auVar30 * ZEXT816(0xc),8) == 0) {
    local_308 = SUB168(auVar30 * ZEXT816(0xc),0);
  }
  local_2c8 = pSubMesh;
  paVar36 = (aiVector3D *)operator_new__((ulong)local_308);
  if (pAVar44 != (Accessor *)0x0) {
    memset(paVar36,0,(((long)pAVar44 * 0xc - 0xcU) / 0xc) * 0xc + 0xc);
  }
  *(aiVector3D **)local_300 = paVar36;
  if (pAVar44 != (Accessor *)0x0) {
    memmove(paVar36,(pSrcMesh->mPositions).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start + sVar28,(long)pAVar44 * 0xc);
  }
  paVar22 = (pSrcMesh->mNormals).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_2e8 = (long)pAVar44->mSubOffset + (sVar28 - 0x38);
  if (local_2e8 <=
      (ulong)(((long)(pSrcMesh->mNormals).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)paVar22 >> 2) *
             -0x5555555555555555)) {
    paVar36 = (aiVector3D *)operator_new__((ulong)local_308);
    if (pAVar44 != (Accessor *)0x0) {
      memset(paVar36,0,(((long)pAVar44 * 0xc - 0xcU) / 0xc) * 0xc + 0xc);
    }
    paVar35->mNormals = paVar36;
    if (pAVar44 != (Accessor *)0x0) {
      memmove(paVar36,paVar22 + sVar28,(long)pAVar44 * 0xc);
    }
  }
  if (local_2e8 <=
      (ulong)(((long)(pSrcMesh->mTangents).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pSrcMesh->mTangents).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)) {
    paVar36 = (aiVector3D *)operator_new__((ulong)local_308);
    if (pAVar44 != (Accessor *)0x0) {
      memset(paVar36,0,(((long)pAVar44 * 0xc - 0xcU) / 0xc) * 0xc + 0xc);
    }
    (local_310._M_head_impl)->mTangents = paVar36;
    if (pAVar44 != (Accessor *)0x0) {
      memmove(paVar36,(pSrcMesh->mTangents).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start + sVar28,(long)pAVar44 * 0xc);
    }
  }
  if (local_2e8 <=
      (ulong)(((long)(pSrcMesh->mBitangents).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pSrcMesh->mBitangents).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)) {
    paVar36 = (aiVector3D *)operator_new__((ulong)local_308);
    if (pAVar44 != (Accessor *)0x0) {
      memset(paVar36,0,(((long)pAVar44 * 0xc - 0xcU) / 0xc) * 0xc + 0xc);
    }
    (local_310._M_head_impl)->mBitangents = paVar36;
    if (pAVar44 != (Accessor *)0x0) {
      memmove(paVar36,(pSrcMesh->mBitangents).
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start + sVar28,(long)pAVar44 * 0xc);
    }
  }
  local_2f0 = (ColladaLoader *)((((long)pAVar44 * 0xc - 0xcU) / 0xc) * 0xc + 0xc);
  lVar67 = 0;
  lVar61 = 0;
  local_300 = pSrcMesh;
  local_2f8 = pAVar44;
  do {
    if (local_2e8 <=
        (ulong)(((long)pSrcMesh->mTexCoords[lVar67].
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)pSrcMesh->mTexCoords[lVar67].
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)) {
      paVar36 = (aiVector3D *)operator_new__((ulong)local_308);
      if (local_2f8 != (Accessor *)0x0) {
        memset(paVar36,0,(size_t)local_2f0);
      }
      (local_310._M_head_impl)->mTextureCoords[lVar61] = paVar36;
      if (local_2f8 != (Accessor *)0x0) {
        lVar62 = 0;
        pAVar44 = local_2f8;
        do {
          paVar22 = pSrcMesh->mTexCoords[lVar67].
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          paVar36 = (local_310._M_head_impl)->mTextureCoords[lVar61];
          *(undefined4 *)((long)&paVar36->z + lVar62) =
               *(undefined4 *)((long)(paVar22 + sVar28) + 8U + lVar62);
          *(undefined8 *)((long)&paVar36->x + lVar62) =
               *(undefined8 *)((long)(paVar22 + sVar28) + lVar62);
          lVar62 = lVar62 + 0xc;
          pAVar44 = (Accessor *)((long)&pAVar44[-1].mData + 7);
        } while (pAVar44 != (Accessor *)0x0);
      }
      (local_310._M_head_impl)->mNumUVComponents[lVar61] = local_300->mNumUVComponents[lVar67];
      lVar61 = lVar61 + 1;
    }
    lVar67 = lVar67 + 1;
  } while (lVar67 != 8);
  uVar37 = (ulong)local_2f8 >> 0x3c;
  uVar65 = (long)local_2f8 << 4;
  lVar62 = 0;
  lVar61 = 0x178;
  lVar67 = local_2e0 * 0x10;
  do {
    if (local_2e8 <=
        (ulong)(*(long *)((long)&(local_300->mName)._M_string_length + lVar61) -
                *(long *)((long)&(local_300->mName)._M_dataplus._M_p + lVar61) >> 4)) {
      paVar38 = (aiColor4D *)operator_new__(-(ulong)(uVar37 != 0) | uVar65);
      if (local_2f8 != (Accessor *)0x0) {
        memset(paVar38,0,uVar65);
      }
      (local_310._M_head_impl)->mColors[lVar62] = paVar38;
      if (local_2f8 != (Accessor *)0x0) {
        memmove((local_310._M_head_impl)->mColors[lVar62],
                (void *)(*(long *)((long)&(local_300->mName)._M_dataplus._M_p + lVar61) + lVar67),
                uVar65);
      }
      lVar62 = lVar62 + 1;
    }
    _Var31._M_head_impl = local_310._M_head_impl;
    lVar61 = lVar61 + 0x18;
  } while (lVar61 != 0x238);
  uVar64 = (uint)local_2c8->mNumFaces;
  uVar37 = local_2c8->mNumFaces & 0xffffffff;
  (local_310._M_head_impl)->mNumFaces = uVar64;
  puVar39 = (ulong *)operator_new__(uVar37 * 0x10 + 8);
  pCVar68 = local_2d8;
  *puVar39 = uVar37;
  paVar40 = (aiFace *)(puVar39 + 1);
  if (uVar64 != 0) {
    paVar60 = paVar40;
    do {
      paVar60->mNumIndices = 0;
      paVar60->mIndices = (uint *)0x0;
      paVar60 = paVar60 + 1;
    } while (paVar60 != paVar40 + uVar37);
  }
  (_Var31._M_head_impl)->mFaces = paVar40;
  if ((local_310._M_head_impl)->mNumFaces != 0) {
    uVar64 = 0;
    uVar37 = 0;
    do {
      uVar65 = (local_300->mFaceSize).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar37 + pStartFace];
      paVar40 = (local_310._M_head_impl)->mFaces;
      paVar40[uVar37].mNumIndices = (uint)uVar65;
      puVar41 = (uint *)operator_new__(-(ulong)(uVar65 >> 0x3e != 0) | uVar65 * 4);
      paVar40[uVar37].mIndices = puVar41;
      if (uVar65 != 0) {
        uVar42 = 0;
        uVar74 = uVar64;
        do {
          uVar64 = uVar74 + 1;
          paVar40[uVar37].mIndices[uVar42] = uVar74;
          uVar42 = uVar42 + 1;
          uVar74 = uVar64;
        } while (uVar65 != uVar42);
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 < (local_310._M_head_impl)->mNumFaces);
  }
  local_298 = (aiMesh **)0x0;
  iStack_290._M_current = (aiMesh **)0x0;
  local_288 = (aiMesh **)0x0;
  local_268 = (float *)0x0;
  local_278 = (void *)0x0;
  iStack_270._M_current = (float *)0x0;
  p_Var50 = (pCVar68->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var72 = &(pCVar68->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var50 == p_Var72) {
    uVar64 = 2;
  }
  else {
    local_308 = (ColladaLoader *)0x0;
    pLibrary_01 = &pCVar68->mMeshLibrary;
    local_2f0 = (ColladaLoader *)&pCVar68->mAccessorLibrary;
    local_2c8 = (SubMesh *)&pCVar68->mDataLibrary;
    local_2f8 = (Accessor *)&local_2c0->mTargetMeshes;
    pMVar71 = local_300;
    local_2b8 = p_Var72;
    do {
      ppMVar43 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Mesh*>
                           (pCVar68,pLibrary_01,(string *)&p_Var50[2]._M_parent);
      if (p_Var50[2]._M_color == _S_black) {
        sVar63 = ((*ppMVar43)->mName)._M_string_length;
        if ((sVar63 == (pMVar71->mName)._M_string_length) &&
           ((sVar63 == 0 ||
            (iVar34 = bcmp(((*ppMVar43)->mName)._M_dataplus._M_p,(pMVar71->mName)._M_dataplus._M_p,
                           sVar63), iVar34 == 0)))) {
          pCVar69 = local_2f0;
          pAVar44 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                              (pCVar68,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>_>
                                        *)local_2f0,(string *)&p_Var50[0xc]._M_right);
          pAVar45 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                              (pCVar68,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>_>
                                        *)pCVar69,(string *)&p_Var50[0xd]._M_right);
          pSVar23 = local_2c8;
          pDVar46 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                              (pCVar68,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data>_>_>
                                        *)local_2c8,&pAVar44->mSource);
          pDVar47 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                              (pCVar68,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data>_>_>
                                        *)pSVar23,&pAVar45->mSource);
          if (pDVar46->mIsStringArray == false) {
            prVar59 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_1a8 = (undefined1  [8])local_198;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"target data must contain id. ","");
            std::runtime_error::runtime_error(prVar59,(string *)local_1a8);
            *(undefined ***)prVar59 = &PTR__runtime_error_0082bce0;
            __cxa_throw(prVar59,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          if (pDVar47->mIsStringArray != false) {
            prVar59 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_1a8 = (undefined1  [8])local_198;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,"target weight data must not be textual ","");
            std::runtime_error::runtime_error(prVar59,(string *)local_1a8);
            *(undefined ***)prVar59 = &PTR__runtime_error_0082bce0;
            __cxa_throw(prVar59,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          local_308 = (ColladaLoader *)(ulong)*(uint *)&p_Var50[2].field_0x4;
          pbVar48 = (pDVar46->mStrings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((pDVar46->mStrings).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish != pbVar48) {
            uVar37 = 0;
            uVar65 = 1;
            do {
              ppMVar43 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Mesh*>
                                   (local_2d8,pLibrary_01,pbVar48 + uVar37);
              pMVar71 = *ppMVar43;
              local_250[0] = findMesh(local_2c0,&pMVar71->mName);
              if (local_250[0] == (aiMesh *)0x0) {
                pSVar23 = (pMVar71->mSubMeshes).
                          super__Vector_base<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                lVar61 = (long)(pMVar71->mSubMeshes).
                               super__Vector_base<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar23;
                if (1 < (ulong)((lVar61 >> 3) * -0x3333333333333333)) {
LAB_00428614:
                  prVar59 = (runtime_error *)__cxa_allocate_exception(0x10);
                  local_1a8 = (undefined1  [8])local_198;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1a8,"Morhing target mesh must be a single","");
                  std::runtime_error::runtime_error(prVar59,(string *)local_1a8);
                  *(undefined ***)prVar59 = &PTR__runtime_error_0082bce0;
                  __cxa_throw(prVar59,&DeadlyImportError::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                if (lVar61 != 0x28) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,0);
                  goto LAB_00428614;
                }
                local_250[0] = CreateMesh(local_2c0,local_2d8,pMVar71,pSVar23,(Controller *)0x0,0,0)
                ;
                __position._M_current =
                     (local_2c0->mTargetMeshes).
                     super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (local_2c0->mTargetMeshes).
                    super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                            ((vector<aiMesh*,std::allocator<aiMesh*>> *)local_2f8,__position,
                             local_250);
                }
                else {
                  *__position._M_current = local_250[0];
                  pppaVar2 = &(local_2c0->mTargetMeshes).
                              super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  *pppaVar2 = *pppaVar2 + 1;
                }
              }
              if (iStack_290._M_current == local_288) {
                std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                          ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_298,iStack_290,
                           local_250);
              }
              else {
                *iStack_290._M_current = local_250[0];
                iStack_290._M_current = iStack_290._M_current + 1;
              }
              pbVar48 = (pDVar46->mStrings).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              bVar29 = uVar65 < (ulong)((long)(pDVar46->mStrings).
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)pbVar48 >> 5);
              uVar37 = uVar65;
              uVar65 = (ulong)((int)uVar65 + 1);
            } while (bVar29);
          }
          pMVar71 = local_300;
          pfVar49 = (pDVar47->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pCVar68 = local_2d8;
          p_Var72 = local_2b8;
          if ((pDVar47->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish != pfVar49) {
            uVar37 = 0;
            uVar65 = 1;
            do {
              if (iStack_270._M_current == local_268) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&local_278,iStack_270,
                           pfVar49 + uVar37);
              }
              else {
                *iStack_270._M_current = pfVar49[uVar37];
                iStack_270._M_current = iStack_270._M_current + 1;
              }
              pfVar49 = (pDVar47->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl
                        .super__Vector_impl_data._M_start;
              bVar29 = uVar65 < (ulong)((long)(pDVar47->mValues).
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                        (long)pfVar49 >> 2);
              uVar37 = uVar65;
              pCVar68 = local_2d8;
              uVar65 = (ulong)((int)uVar65 + 1);
              p_Var72 = local_2b8;
            } while (bVar29);
          }
        }
      }
      p_Var50 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var50);
    } while (p_Var50 != p_Var72);
    uVar64 = (int)local_308 == 1 | 2;
  }
  if (((long)iStack_290._M_current - (long)local_298 != 0) &&
     ((long)iStack_270._M_current - (long)local_278 >> 2 ==
      (long)iStack_290._M_current - (long)local_298 >> 3)) {
    local_1a8._0_4_ = 0;
    local_1a8._4_4_ = 0.0;
    aStack_1a0.mVertexId = 0;
    aStack_1a0.mWeight = 0.0;
    local_198[0]._0_4_ = 0;
    local_198[0]._4_4_ = 0.0;
    if (iStack_290._M_current != local_298) {
      uVar37 = 0;
      uVar65 = 1;
      do {
        paVar35 = local_298[uVar37];
        paVar51 = (aiMesh *)aiCreateAnimMesh(paVar35);
        fVar75 = *(float *)((long)local_278 + uVar37 * 4);
        uVar74 = -(uint)(fVar75 == 0.0);
        *(uint *)((paVar51->mName).data + 0x3bc) = uVar74 & 0x3f800000 | ~uVar74 & (uint)fVar75;
        local_250[0] = paVar51;
        if (paVar51 != (aiMesh *)&paVar35->mName) {
          uVar74 = (paVar35->mName).length;
          paVar51->mPrimitiveTypes = uVar74;
          memcpy(&paVar51->mNumVertices,(paVar35->mName).data,(ulong)uVar74);
          *(undefined1 *)((long)paVar51->mColors + ((ulong)uVar74 - 0x2c)) = 0;
        }
        if (aStack_1a0 == (aiVertexWeight)local_198[0]._0_8_) {
          std::vector<aiAnimMesh*,std::allocator<aiAnimMesh*>>::_M_realloc_insert<aiAnimMesh*const&>
                    ((vector<aiAnimMesh*,std::allocator<aiAnimMesh*>> *)local_1a8,
                     (iterator)aStack_1a0,(aiAnimMesh **)local_250);
        }
        else {
          *(aiMesh **)aStack_1a0 = local_250[0];
          aStack_1a0 = (aiVertexWeight)((long)aStack_1a0 + 8);
        }
        bVar29 = uVar65 < (ulong)((long)iStack_290._M_current - (long)local_298 >> 3);
        uVar37 = uVar65;
        uVar65 = (ulong)((int)uVar65 + 1);
      } while (bVar29);
    }
    _Var31._M_head_impl = local_310._M_head_impl;
    (local_310._M_head_impl)->mMethod = uVar64;
    uVar37 = (long)aStack_1a0 - (long)local_1a8 >> 3;
    ppaVar52 = (aiAnimMesh **)
               operator_new__(-(ulong)(uVar37 >> 0x3d != 0) | (long)aStack_1a0 - (long)local_1a8);
    pCVar68 = local_2d8;
    (_Var31._M_head_impl)->mAnimMeshes = ppaVar52;
    (_Var31._M_head_impl)->mNumAnimMeshes = (uint)uVar37;
    if (aStack_1a0 != (aiVertexWeight)local_1a8) {
      uVar64 = 1;
      uVar37 = 0;
      do {
        (local_310._M_head_impl)->mAnimMeshes[uVar37] =
             *(aiAnimMesh **)((long)local_1a8 + uVar37 * 8);
        uVar37 = (ulong)uVar64;
        uVar64 = uVar64 + 1;
      } while (uVar37 < (ulong)((long)aStack_1a0 - (long)local_1a8 >> 3));
    }
    if ((aiVertexWeight)local_1a8 != (aiVertexWeight)0x0) {
      operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity - (long)local_1a8);
    }
  }
  if ((local_2d0 != (Controller *)0x0) && (local_2d0->mType == Skin)) {
    pLibrary = &pCVar68->mAccessorLibrary;
    pAVar44 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                        (pCVar68,pLibrary,&local_2d0->mJointNameSource);
    pLibrary_00 = &pCVar68->mDataLibrary;
    local_260 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                          (pCVar68,pLibrary_00,&pAVar44->mSource);
    pAVar45 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                        (pCVar68,pLibrary,&local_2d0->mJointOffsetMatrixSource);
    local_208 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                          (pCVar68,pLibrary_00,&pAVar45->mSource);
    pAVar53 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                        (pCVar68,pLibrary,&(local_2d0->mWeightInputJoints).mAccessor);
    if (pAVar53 != pAVar44) {
      prVar59 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,
                 "Temporary implementational laziness. If you read this, please report to the author."
                 ,"");
      std::runtime_error::runtime_error(prVar59,(string *)local_1a8);
      *(undefined ***)prVar59 = &PTR__runtime_error_0082bce0;
      __cxa_throw(prVar59,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pAVar53 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                        (pCVar68,pLibrary,&(local_2d0->mWeightInputWeights).mAccessor);
    pDVar46 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                        (pCVar68,pLibrary_00,&pAVar53->mSource);
    pCVar66 = local_2d0;
    if (((local_260->mIsStringArray != true) || (local_208->mIsStringArray != false)) ||
       (pDVar46->mIsStringArray == true)) {
      prVar59 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"Data type mismatch while resolving mesh joints","");
      std::runtime_error::runtime_error(prVar59,(string *)local_1a8);
      *(undefined ***)prVar59 = &PTR__runtime_error_0082bce0;
      __cxa_throw(prVar59,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_2f8 = pAVar53;
    if (((local_2d0->mWeightInputJoints).mOffset != 0) ||
       ((local_2d0->mWeightInputWeights).mOffset != 1)) {
      prVar59 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"Unsupported vertex_weight addressing scheme. ","");
      std::runtime_error::runtime_error(prVar59,(string *)local_1a8);
      *(undefined ***)prVar59 = &PTR__runtime_error_0082bce0;
      __cxa_throw(prVar59,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pCVar24 = (ColladaLoader *)
              (local_260->mStrings).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar25 = (ColladaLoader *)
              (local_260->mStrings).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_258 = (aiColor4D *)((long)pCVar25 - (long)pCVar24 >> 5);
    std::
    vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
    ::vector(&local_1f0,(size_type)local_258,(allocator_type *)local_1a8);
    pCVar69 = (ColladaLoader *)local_1d8;
    local_1d8._0_8_ = (aiColor4D *)0x0;
    local_1d8._8_8_ = (aiVector3D *)0x0;
    local_1c8 = (aiVector3D *)0x0;
    local_1a8 = (undefined1  [8])
                (pCVar66->mWeights).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    std::
    vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
    ::resize((vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
              *)pCVar69,
             (long)(pCVar66->mWeightCounts).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pCVar66->mWeightCounts).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(value_type *)local_1a8);
    if ((pCVar66->mWeightCounts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (pCVar66->mWeightCounts).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      ppVar54 = (pCVar66->mWeights).
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar37 = 0;
      do {
        *(pointer *)((float *)local_1d8._0_8_ + uVar37 * 2) = ppVar54;
        puVar26 = (pCVar66->mWeightCounts).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pCVar69 = (ColladaLoader *)(puVar26[uVar37] * 0x10);
        ppVar54 = (pointer)((long)&ppVar54->first +
                           (long)&(pCVar69->super_BaseImporter)._vptr_BaseImporter);
        uVar37 = uVar37 + 1;
      } while (uVar37 < (ulong)((long)(pCVar66->mWeightCounts).
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar26 >>
                               3));
    }
    uVar37 = local_2e0;
    local_308 = pCVar24;
    local_2f0 = pCVar25;
    local_1b8 = pAVar45;
    local_1b0 = pAVar44;
    if (local_2e0 < local_2e8) {
      do {
        uVar27 = (local_300->mFacePosIndices).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar37];
        uVar73 = (pCVar66->mWeightCounts).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar27];
        if (uVar73 != 0) {
          uVar64 = (int)uVar37 - (int)local_2e0;
          psVar70 = (size_t *)(*(long *)((float *)local_1d8._0_8_ + uVar27 * 2) + 8);
          do {
            sVar28 = psVar70[-1];
            fVar75 = 1.0;
            if ((pDVar46->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pDVar46->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              fVar75 = ReadFloat(pCVar69,local_2f8,pDVar46,*psVar70,0);
            }
            if (0.0 < fVar75) {
              local_1a8._4_4_ = fVar75;
              local_1a8._0_4_ = uVar64;
              pCVar69 = (ColladaLoader *)
                        ((long)local_1f0.
                               super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + sVar28 * 0x18);
              __position_00._M_current =
                   *(aiVertexWeight **)&(pCVar69->super_BaseImporter).importerUnits._M_t._M_impl;
              if (__position_00._M_current ==
                  *(aiVertexWeight **)
                   &(pCVar69->super_BaseImporter).importerUnits._M_t._M_impl.super__Rb_tree_header.
                    _M_header) {
                std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>::
                _M_realloc_insert<aiVertexWeight_const&>
                          ((vector<aiVertexWeight,std::allocator<aiVertexWeight>> *)pCVar69,
                           __position_00,(aiVertexWeight *)local_1a8);
              }
              else {
                (__position_00._M_current)->mVertexId = uVar64;
                (__position_00._M_current)->mWeight = fVar75;
                pmVar1 = &(pCVar69->super_BaseImporter).importerUnits;
                *(long *)&(pmVar1->_M_t)._M_impl = *(long *)&(pmVar1->_M_t)._M_impl + 8;
              }
            }
            psVar70 = psVar70 + 2;
            uVar73 = uVar73 - 1;
          } while (uVar73 != 0);
        }
        uVar37 = uVar37 + 1;
        pCVar66 = local_2d0;
      } while (uVar37 != local_2e8);
    }
    pCVar24 = local_2f0;
    pCVar69 = local_308;
    _Var31._M_head_impl = local_310._M_head_impl;
    uVar37 = 0;
    for (paVar38 = (aiColor4D *)
                   local_1f0.
                   super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        paVar38 !=
        (aiColor4D *)
        local_1f0.
        super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; paVar38 = (aiColor4D *)&paVar38[1].b) {
      uVar37 = uVar37 + (*(pointer *)&paVar38->b != *(pointer *)paVar38);
    }
    (local_310._M_head_impl)->mNumBones = (uint)uVar37;
    ppaVar55 = (aiBone **)operator_new__(-(ulong)(uVar37 >> 0x3d != 0) | uVar37 << 3);
    (_Var31._M_head_impl)->mBones = ppaVar55;
    if (pCVar24 != pCVar69) {
      local_258 = (aiColor4D *)((long)&local_258->r + (ulong)(local_258 == (aiColor4D *)0x0));
      pCVar69 = (ColladaLoader *)0x8;
      paVar38 = (aiColor4D *)0x0;
      local_1f8 = (aiColor4D *)0x0;
      do {
        if (*(long *)((long)&((aiColor4D *)
                             ((long)local_1f0.
                                    super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + -0x10))->b +
                     (long)pCVar69) !=
            *(long *)((long)&((local_1f0.
                               super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                             _M_impl.super__Vector_impl_data._M_start +
                     (long)&(pCVar69->super_BaseImporter)._vptr_BaseImporter)) {
          local_308 = pCVar69;
          paVar56 = (aiBone *)operator_new(0x460);
          (paVar56->mName).length = 0;
          local_2f0 = (ColladaLoader *)(paVar56->mName).data;
          (paVar56->mName).data[0] = '\0';
          pCVar69 = (ColladaLoader *)((paVar56->mName).data + 1);
          memset(pCVar69,0x1b,0x3ff);
          paVar56->mNumWeights = 0;
          paVar56->mWeights = (aiVertexWeight *)0x0;
          (paVar56->mOffsetMatrix).a1 = 1.0;
          (paVar56->mOffsetMatrix).a2 = 0.0;
          (paVar56->mOffsetMatrix).a3 = 0.0;
          (paVar56->mOffsetMatrix).a4 = 0.0;
          (paVar56->mOffsetMatrix).b1 = 0.0;
          (paVar56->mOffsetMatrix).b2 = 1.0;
          (paVar56->mOffsetMatrix).b3 = 0.0;
          (paVar56->mOffsetMatrix).b4 = 0.0;
          (paVar56->mOffsetMatrix).c1 = 0.0;
          (paVar56->mOffsetMatrix).c2 = 0.0;
          (paVar56->mOffsetMatrix).c3 = 1.0;
          (paVar56->mOffsetMatrix).c4 = 0.0;
          (paVar56->mOffsetMatrix).d1 = 0.0;
          (paVar56->mOffsetMatrix).d2 = 0.0;
          (paVar56->mOffsetMatrix).d3 = 0.0;
          (paVar56->mOffsetMatrix).d4 = 1.0;
          psVar57 = ReadString_abi_cxx11_(pCVar69,local_1b0,local_260,(size_t)paVar38);
          uVar37 = psVar57->_M_string_length;
          if (uVar37 < 0x400) {
            (paVar56->mName).length = (ai_uint32)uVar37;
            pCVar69 = local_2f0;
            memcpy(local_2f0,(psVar57->_M_dataplus)._M_p,uVar37);
            (paVar56->mName).data[uVar37] = '\0';
          }
          pAVar44 = local_1b8;
          pDVar46 = local_208;
          aVar76 = ReadFloat(pCVar69,local_1b8,local_208,(size_t)paVar38,0);
          (paVar56->mOffsetMatrix).a1 = aVar76;
          aVar76 = ReadFloat(pCVar69,pAVar44,pDVar46,(size_t)paVar38,1);
          (paVar56->mOffsetMatrix).a2 = aVar76;
          aVar76 = ReadFloat(pCVar69,pAVar44,pDVar46,(size_t)paVar38,2);
          (paVar56->mOffsetMatrix).a3 = aVar76;
          aVar76 = ReadFloat(pCVar69,pAVar44,pDVar46,(size_t)paVar38,3);
          (paVar56->mOffsetMatrix).a4 = aVar76;
          aVar76 = ReadFloat(pCVar69,pAVar44,pDVar46,(size_t)paVar38,4);
          (paVar56->mOffsetMatrix).b1 = aVar76;
          aVar76 = ReadFloat(pCVar69,pAVar44,pDVar46,(size_t)paVar38,5);
          (paVar56->mOffsetMatrix).b2 = aVar76;
          aVar76 = ReadFloat(pCVar69,pAVar44,pDVar46,(size_t)paVar38,6);
          (paVar56->mOffsetMatrix).b3 = aVar76;
          aVar76 = ReadFloat(pCVar69,pAVar44,pDVar46,(size_t)paVar38,7);
          (paVar56->mOffsetMatrix).b4 = aVar76;
          aVar76 = ReadFloat(pCVar69,pAVar44,pDVar46,(size_t)paVar38,8);
          (paVar56->mOffsetMatrix).c1 = aVar76;
          aVar76 = ReadFloat(pCVar69,pAVar44,pDVar46,(size_t)paVar38,9);
          (paVar56->mOffsetMatrix).c2 = aVar76;
          aVar76 = ReadFloat(pCVar69,pAVar44,pDVar46,(size_t)paVar38,10);
          (paVar56->mOffsetMatrix).c3 = aVar76;
          aVar76 = ReadFloat(pCVar69,pAVar44,pDVar46,(size_t)paVar38,0xb);
          pvVar32 = local_1f0.
                    super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          (paVar56->mOffsetMatrix).c4 = aVar76;
          uVar65 = *(long *)((long)&((local_1f0.
                                      super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                    )._M_impl.super__Vector_impl_data._M_start +
                            (long)&(local_308->super_BaseImporter)._vptr_BaseImporter) -
                   *(long *)((long)&((aiColor4D *)
                                    ((long)local_1f0.
                                           super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + -0x10))->b +
                            (long)local_308) >> 3;
          paVar56->mNumWeights = (uint)uVar65;
          uVar65 = uVar65 & 0xffffffff;
          uVar37 = uVar65 * 8;
          __s = (aiVertexWeight *)operator_new__(uVar37);
          if (uVar65 != 0) {
            memset(__s,0,uVar37);
          }
          pCVar68 = local_2d8;
          paVar56->mWeights = __s;
          __src = *(void **)((long)&((aiColor4D *)((long)pvVar32 + -0x10))->b + (long)local_308);
          sVar63 = *(long *)((long)&(pvVar32->
                                    super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                    )._M_impl.super__Vector_impl_data._M_start +
                            (long)&(local_308->super_BaseImporter)._vptr_BaseImporter) - (long)__src
          ;
          local_200 = paVar38;
          if (sVar63 != 0) {
            memmove(__s,__src,sVar63);
          }
          pCVar69 = local_2f0;
          fVar75 = local_2d0->mBindShapeMatrix[0];
          local_2a0 = local_2d0->mBindShapeMatrix[1];
          local_228 = local_2d0->mBindShapeMatrix[4];
          local_2a4 = local_2d0->mBindShapeMatrix[5];
          fVar3 = local_2d0->mBindShapeMatrix[6];
          local_300 = (Mesh *)CONCAT44(local_300._4_4_,fVar3);
          fVar4 = local_2d0->mBindShapeMatrix[8];
          fVar5 = local_2d0->mBindShapeMatrix[9];
          local_2e8 = CONCAT44(local_2e8._4_4_,fVar5);
          fVar6 = local_2d0->mBindShapeMatrix[0xc];
          fVar7 = local_2d0->mBindShapeMatrix[0xd];
          local_2f8 = (Accessor *)CONCAT44(local_2f8._4_4_,fVar7);
          fVar8 = (paVar56->mOffsetMatrix).a1;
          fVar9 = (paVar56->mOffsetMatrix).a2;
          fVar10 = (paVar56->mOffsetMatrix).a3;
          fVar11 = (paVar56->mOffsetMatrix).a4;
          local_2c8 = (SubMesh *)CONCAT44(local_2c8._4_4_,fVar6);
          local_20c = fVar6 * fVar11 + fVar4 * fVar10 + fVar75 * fVar8 + local_228 * fVar9;
          local_210 = fVar7 * fVar11 + fVar5 * fVar10 + local_2a0 * fVar8 + local_2a4 * fVar9;
          local_22c = local_2d0->mBindShapeMatrix[2];
          fVar12 = local_2d0->mBindShapeMatrix[10];
          local_2e0 = CONCAT44(local_2e0._4_4_,fVar12);
          local_2a8 = local_2d0->mBindShapeMatrix[0xe];
          local_214 = local_2a8 * fVar11 + fVar12 * fVar10 + local_22c * fVar8 + fVar3 * fVar9;
          local_240._16_4_ = local_2d0->mBindShapeMatrix[7];
          local_2ac = local_2d0->mBindShapeMatrix[3];
          fVar13 = local_2d0->mBindShapeMatrix[0xb];
          local_2b8 = (_Rb_tree_node_base *)CONCAT44(local_2b8._4_4_,fVar13);
          local_29c = local_2d0->mBindShapeMatrix[0xf];
          local_218 = fVar11 * local_29c +
                      fVar10 * fVar13 + fVar8 * local_2ac + fVar9 * (float)local_240._16_4_;
          fVar8 = (paVar56->mOffsetMatrix).b2;
          fVar9 = (paVar56->mOffsetMatrix).b1;
          fVar10 = (paVar56->mOffsetMatrix).b3;
          fVar11 = (paVar56->mOffsetMatrix).b4;
          local_21c = fVar6 * fVar11 + fVar4 * fVar10 + fVar75 * fVar9 + local_228 * fVar8;
          local_220 = fVar7 * fVar11 + fVar5 * fVar10 + local_2a0 * fVar9 + local_2a4 * fVar8;
          local_224 = local_2a8 * fVar11 + fVar12 * fVar10 + local_22c * fVar9 + fVar3 * fVar8;
          fVar14 = (paVar56->mOffsetMatrix).c2;
          fVar15 = (paVar56->mOffsetMatrix).c1;
          fVar16 = (paVar56->mOffsetMatrix).c3;
          fVar17 = (paVar56->mOffsetMatrix).c4;
          fVar18 = (paVar56->mOffsetMatrix).d2;
          fVar19 = (paVar56->mOffsetMatrix).d1;
          fVar20 = (paVar56->mOffsetMatrix).d3;
          fVar21 = (paVar56->mOffsetMatrix).d4;
          (paVar56->mOffsetMatrix).a1 = local_20c;
          (paVar56->mOffsetMatrix).a2 = local_210;
          (paVar56->mOffsetMatrix).a3 = local_214;
          (paVar56->mOffsetMatrix).a4 = local_218;
          (paVar56->mOffsetMatrix).b1 = local_21c;
          (paVar56->mOffsetMatrix).b2 = local_220;
          (paVar56->mOffsetMatrix).b3 = local_224;
          (paVar56->mOffsetMatrix).b4 =
               fVar11 * local_29c +
               fVar10 * fVar13 + fVar9 * local_2ac + fVar8 * (float)local_240._16_4_;
          (paVar56->mOffsetMatrix).c1 =
               fVar6 * fVar17 + fVar4 * fVar16 + fVar75 * fVar15 + local_228 * fVar14;
          (paVar56->mOffsetMatrix).c2 =
               fVar7 * fVar17 + fVar5 * fVar16 + local_2a0 * fVar15 + local_2a4 * fVar14;
          (paVar56->mOffsetMatrix).c3 =
               local_2a8 * fVar17 + fVar12 * fVar16 + local_22c * fVar15 + fVar3 * fVar14;
          (paVar56->mOffsetMatrix).c4 =
               fVar17 * local_29c +
               fVar16 * fVar13 + fVar15 * local_2ac + fVar14 * (float)local_240._16_4_;
          (paVar56->mOffsetMatrix).d1 =
               fVar6 * fVar21 + fVar4 * fVar20 + fVar75 * fVar19 + local_228 * fVar18;
          (paVar56->mOffsetMatrix).d2 =
               fVar7 * fVar21 + fVar5 * fVar20 + local_2a0 * fVar19 + local_2a4 * fVar18;
          (paVar56->mOffsetMatrix).d3 =
               local_2a8 * fVar21 + fVar12 * fVar20 + local_22c * fVar19 + fVar3 * fVar18;
          (paVar56->mOffsetMatrix).d4 =
               local_29c * fVar21 +
               fVar13 * fVar20 + local_2ac * fVar19 + (float)local_240._16_4_ * fVar18;
          pNVar58 = pCVar68->mRootNode;
          local_1a8 = (undefined1  [8])local_198;
          sVar63 = strlen((char *)local_2f0);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,pCVar69,
                     (long)&(pCVar69->super_BaseImporter)._vptr_BaseImporter + sVar63);
          pCVar69 = local_2c0;
          pNVar58 = FindNode(local_2c0,pNVar58,(string *)local_1a8);
          if (local_1a8 != (undefined1  [8])local_198) {
            operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
          }
          pCVar24 = local_2f0;
          if (pNVar58 == (Node *)0x0) {
            pNVar58 = pCVar68->mRootNode;
            local_1a8 = (undefined1  [8])local_198;
            sVar63 = strlen((char *)local_2f0);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1a8,pCVar24,
                       (long)&(pCVar24->super_BaseImporter)._vptr_BaseImporter + sVar63);
            pCVar69 = local_2c0;
            pNVar58 = FindNodeBySID(local_2c0,pNVar58,(string *)local_1a8);
            if (local_1a8 != (undefined1  [8])local_198) {
              operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
            }
          }
          if (pNVar58 == (Node *)0x0) {
            this_00 = DefaultLogger::get();
            paVar38 = local_200;
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[75]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1a8,
                       (char (*) [75])
                       "ColladaLoader::CreateMesh(): could not find corresponding node for joint \""
                      );
            pCVar69 = local_2f0;
            sVar63 = strlen((char *)local_2f0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(char *)pCVar69,sVar63);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
            std::__cxx11::stringbuf::str();
            Logger::warn(this_00,(char *)local_250[0]);
            pCVar69 = local_308;
            if (local_250[0] != (aiMesh *)local_240) {
              operator_delete(local_250[0],local_240._0_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
          }
          else {
            FindNameForNode_abi_cxx11_((string *)local_1a8,pCVar69,pNVar58);
            aVar33 = aStack_1a0;
            paVar38 = local_200;
            if ((ulong)aStack_1a0 < 0x400) {
              (paVar56->mName).length = aStack_1a0.mVertexId;
              memcpy(local_2f0,(void *)local_1a8,(size_t)aStack_1a0);
              (paVar56->mName).data[(long)aVar33] = '\0';
            }
            pCVar69 = local_308;
            if (local_1a8 != (undefined1  [8])local_198) {
              operator_delete((void *)local_1a8,local_198[0]._M_allocated_capacity + 1);
              pCVar69 = local_308;
            }
          }
          (local_310._M_head_impl)->mBones[(long)local_1f8] = paVar56;
          local_1f8 = (aiColor4D *)((long)&local_1f8->r + 1);
        }
        paVar38 = (aiColor4D *)((long)&paVar38->r + 1);
        pCVar69 = (ColladaLoader *)
                  ((long)&(pCVar69->super_BaseImporter).importerUnits._M_t._M_impl.
                          super__Rb_tree_header + 8);
      } while (local_258 != paVar38);
    }
    if ((aiColor4D *)local_1d8._0_8_ != (aiColor4D *)0x0) {
      operator_delete((void *)local_1d8._0_8_,(long)local_1c8 - local_1d8._0_8_);
    }
    std::
    vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
    ::~vector(&local_1f0);
  }
  _Var31._M_head_impl = local_310._M_head_impl;
  local_310._M_head_impl = (aiMesh *)0x0;
  if (local_278 != (void *)0x0) {
    operator_delete(local_278,(long)local_268 - (long)local_278);
  }
  if (local_298 != (aiMesh **)0x0) {
    operator_delete(local_298,(long)local_288 - (long)local_298);
  }
  std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr
            ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)&local_310);
  return _Var31._M_head_impl;
}

Assistant:

aiMesh* ColladaLoader::CreateMesh(const ColladaParser& pParser, const Collada::Mesh* pSrcMesh, const Collada::SubMesh& pSubMesh,
    const Collada::Controller* pSrcController, size_t pStartVertex, size_t pStartFace) {
    std::unique_ptr<aiMesh> dstMesh(new aiMesh);

    dstMesh->mName = pSrcMesh->mName;

    // count the vertices addressed by its faces
    const size_t numVertices = std::accumulate(pSrcMesh->mFaceSize.begin() + pStartFace,
        pSrcMesh->mFaceSize.begin() + pStartFace + pSubMesh.mNumFaces, size_t(0));

    // copy positions
    dstMesh->mNumVertices = static_cast<unsigned int>(numVertices);
    dstMesh->mVertices = new aiVector3D[numVertices];
    std::copy(pSrcMesh->mPositions.begin() + pStartVertex, pSrcMesh->mPositions.begin() +
        pStartVertex + numVertices, dstMesh->mVertices);

    // normals, if given. HACK: (thom) Due to the glorious Collada spec we never
    // know if we have the same number of normals as there are positions. So we
    // also ignore any vertex attribute if it has a different count
    if (pSrcMesh->mNormals.size() >= pStartVertex + numVertices) {
        dstMesh->mNormals = new aiVector3D[numVertices];
        std::copy(pSrcMesh->mNormals.begin() + pStartVertex, pSrcMesh->mNormals.begin() +
            pStartVertex + numVertices, dstMesh->mNormals);
    }

    // tangents, if given.
    if (pSrcMesh->mTangents.size() >= pStartVertex + numVertices) {
        dstMesh->mTangents = new aiVector3D[numVertices];
        std::copy(pSrcMesh->mTangents.begin() + pStartVertex, pSrcMesh->mTangents.begin() +
            pStartVertex + numVertices, dstMesh->mTangents);
    }

    // bitangents, if given.
    if (pSrcMesh->mBitangents.size() >= pStartVertex + numVertices) {
        dstMesh->mBitangents = new aiVector3D[numVertices];
        std::copy(pSrcMesh->mBitangents.begin() + pStartVertex, pSrcMesh->mBitangents.begin() +
            pStartVertex + numVertices, dstMesh->mBitangents);
    }

    // same for texturecoords, as many as we have
    // empty slots are not allowed, need to pack and adjust UV indexes accordingly
    for (size_t a = 0, real = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a) {
        if (pSrcMesh->mTexCoords[a].size() >= pStartVertex + numVertices) {
            dstMesh->mTextureCoords[real] = new aiVector3D[numVertices];
            for (size_t b = 0; b < numVertices; ++b) {
                dstMesh->mTextureCoords[real][b] = pSrcMesh->mTexCoords[a][pStartVertex + b];
            }

            dstMesh->mNumUVComponents[real] = pSrcMesh->mNumUVComponents[a];
            ++real;
        }
    }

    // same for vertex colors, as many as we have. again the same packing to avoid empty slots
    for (size_t a = 0, real = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a) {
        if (pSrcMesh->mColors[a].size() >= pStartVertex + numVertices) {
            dstMesh->mColors[real] = new aiColor4D[numVertices];
            std::copy(pSrcMesh->mColors[a].begin() + pStartVertex, pSrcMesh->mColors[a].begin() + pStartVertex + numVertices, dstMesh->mColors[real]);
            ++real;
        }
    }

    // create faces. Due to the fact that each face uses unique vertices, we can simply count up on each vertex
    size_t vertex = 0;
    dstMesh->mNumFaces = static_cast<unsigned int>(pSubMesh.mNumFaces);
    dstMesh->mFaces = new aiFace[dstMesh->mNumFaces];
    for (size_t a = 0; a < dstMesh->mNumFaces; ++a) {
        size_t s = pSrcMesh->mFaceSize[pStartFace + a];
        aiFace& face = dstMesh->mFaces[a];
        face.mNumIndices = static_cast<unsigned int>(s);
        face.mIndices = new unsigned int[s];
        for (size_t b = 0; b < s; ++b) {
            face.mIndices[b] = static_cast<unsigned int>(vertex++);
        }
    }

    // create morph target meshes if any
    std::vector<aiMesh*> targetMeshes;
    std::vector<float> targetWeights;
    Collada::MorphMethod method = Collada::Normalized;

    for (std::map<std::string, Collada::Controller>::const_iterator it = pParser.mControllerLibrary.begin();
        it != pParser.mControllerLibrary.end(); ++it) {
        const Collada::Controller &c = it->second;
        const Collada::Mesh* baseMesh = pParser.ResolveLibraryReference(pParser.mMeshLibrary, c.mMeshId);

        if (c.mType == Collada::Morph && baseMesh->mName == pSrcMesh->mName) {
            const Collada::Accessor& targetAccessor = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, c.mMorphTarget);
            const Collada::Accessor& weightAccessor = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, c.mMorphWeight);
            const Collada::Data& targetData = pParser.ResolveLibraryReference(pParser.mDataLibrary, targetAccessor.mSource);
            const Collada::Data& weightData = pParser.ResolveLibraryReference(pParser.mDataLibrary, weightAccessor.mSource);

            // take method
            method = c.mMethod;

            if (!targetData.mIsStringArray) {
                throw DeadlyImportError("target data must contain id. ");
            }
            if (weightData.mIsStringArray) {
                throw DeadlyImportError("target weight data must not be textual ");
            }

            for (unsigned int i = 0; i < targetData.mStrings.size(); ++i) {
                const Collada::Mesh* targetMesh = pParser.ResolveLibraryReference(pParser.mMeshLibrary, targetData.mStrings.at(i));

                aiMesh *aimesh = findMesh(targetMesh->mName);
                if (!aimesh) {
                    if (targetMesh->mSubMeshes.size() > 1) {
                        throw DeadlyImportError("Morhing target mesh must be a single");
                    }
                    aimesh = CreateMesh(pParser, targetMesh, targetMesh->mSubMeshes.at(0), NULL, 0, 0);
                    mTargetMeshes.push_back(aimesh);
                }
                targetMeshes.push_back(aimesh);
            }
            for (unsigned int i = 0; i < weightData.mValues.size(); ++i) {
                targetWeights.push_back(weightData.mValues.at(i));
            }
        }
    }
    if (targetMeshes.size() > 0 && targetWeights.size() == targetMeshes.size()) {
        std::vector<aiAnimMesh*> animMeshes;
        for (unsigned int i = 0; i < targetMeshes.size(); ++i) {
            aiMesh* targetMesh = targetMeshes.at(i);
            aiAnimMesh *animMesh = aiCreateAnimMesh(targetMesh);
            float weight = targetWeights[i];
            animMesh->mWeight = weight == 0 ? 1.0f : weight;
            animMesh->mName = targetMesh->mName;
            animMeshes.push_back(animMesh);
        }
        dstMesh->mMethod = (method == Collada::Relative)
            ? aiMorphingMethod_MORPH_RELATIVE
            : aiMorphingMethod_MORPH_NORMALIZED;
        dstMesh->mAnimMeshes = new aiAnimMesh*[animMeshes.size()];
        dstMesh->mNumAnimMeshes = static_cast<unsigned int>(animMeshes.size());
        for (unsigned int i = 0; i < animMeshes.size(); ++i) {
            dstMesh->mAnimMeshes[i] = animMeshes.at(i);
        }
    }

    // create bones if given
    if (pSrcController && pSrcController->mType == Collada::Skin) {
        // resolve references - joint names
        const Collada::Accessor& jointNamesAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mJointNameSource);
        const Collada::Data& jointNames = pParser.ResolveLibraryReference(pParser.mDataLibrary, jointNamesAcc.mSource);
        // joint offset matrices
        const Collada::Accessor& jointMatrixAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mJointOffsetMatrixSource);
        const Collada::Data& jointMatrices = pParser.ResolveLibraryReference(pParser.mDataLibrary, jointMatrixAcc.mSource);
        // joint vertex_weight name list - should refer to the same list as the joint names above. If not, report and reconsider
        const Collada::Accessor& weightNamesAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mWeightInputJoints.mAccessor);
        if (&weightNamesAcc != &jointNamesAcc)
            throw DeadlyImportError("Temporary implementational laziness. If you read this, please report to the author.");
        // vertex weights
        const Collada::Accessor& weightsAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mWeightInputWeights.mAccessor);
        const Collada::Data& weights = pParser.ResolveLibraryReference(pParser.mDataLibrary, weightsAcc.mSource);

        if (!jointNames.mIsStringArray || jointMatrices.mIsStringArray || weights.mIsStringArray)
            throw DeadlyImportError("Data type mismatch while resolving mesh joints");
        // sanity check: we rely on the vertex weights always coming as pairs of BoneIndex-WeightIndex
        if (pSrcController->mWeightInputJoints.mOffset != 0 || pSrcController->mWeightInputWeights.mOffset != 1)
            throw DeadlyImportError("Unsupported vertex_weight addressing scheme. ");

        // create containers to collect the weights for each bone
        size_t numBones = jointNames.mStrings.size();
        std::vector<std::vector<aiVertexWeight> > dstBones(numBones);

        // build a temporary array of pointers to the start of each vertex's weights
        typedef std::vector< std::pair<size_t, size_t> > IndexPairVector;
        std::vector<IndexPairVector::const_iterator> weightStartPerVertex;
        weightStartPerVertex.resize(pSrcController->mWeightCounts.size(), pSrcController->mWeights.end());

        IndexPairVector::const_iterator pit = pSrcController->mWeights.begin();
        for (size_t a = 0; a < pSrcController->mWeightCounts.size(); ++a) {
            weightStartPerVertex[a] = pit;
            pit += pSrcController->mWeightCounts[a];
        }

        // now for each vertex put the corresponding vertex weights into each bone's weight collection
        for (size_t a = pStartVertex; a < pStartVertex + numVertices; ++a) {
            // which position index was responsible for this vertex? that's also the index by which
            // the controller assigns the vertex weights
            size_t orgIndex = pSrcMesh->mFacePosIndices[a];
            // find the vertex weights for this vertex
            IndexPairVector::const_iterator iit = weightStartPerVertex[orgIndex];
            size_t pairCount = pSrcController->mWeightCounts[orgIndex];


            for( size_t b = 0; b < pairCount; ++b, ++iit) {
                const size_t jointIndex = iit->first;
                const size_t vertexIndex = iit->second;                
                ai_real weight = 1.0f;
                if (!weights.mValues.empty()) {
                    weight = ReadFloat(weightsAcc, weights, vertexIndex, 0);
                }

                // one day I gonna kill that XSI Collada exporter
                if (weight > 0.0f)
                {
                    aiVertexWeight w;
                    w.mVertexId = static_cast<unsigned int>(a - pStartVertex);
                    w.mWeight = weight;
                    dstBones[jointIndex].push_back(w);
                }
            }
        }

        // count the number of bones which influence vertices of the current submesh
        size_t numRemainingBones = 0;
        for( std::vector<std::vector<aiVertexWeight> >::const_iterator it = dstBones.begin(); it != dstBones.end(); ++it) {
            if( it->size() > 0) {
                ++numRemainingBones;
            }
        }

        // create bone array and copy bone weights one by one
        dstMesh->mNumBones = static_cast<unsigned int>(numRemainingBones);
        dstMesh->mBones = new aiBone*[numRemainingBones];
        size_t boneCount = 0;
        for( size_t a = 0; a < numBones; ++a) {
            // omit bones without weights
            if( dstBones[a].empty() ) {
                continue;
            }

            // create bone with its weights
            aiBone* bone = new aiBone;
            bone->mName = ReadString(jointNamesAcc, jointNames, a);
            bone->mOffsetMatrix.a1 = ReadFloat(jointMatrixAcc, jointMatrices, a, 0);
            bone->mOffsetMatrix.a2 = ReadFloat(jointMatrixAcc, jointMatrices, a, 1);
            bone->mOffsetMatrix.a3 = ReadFloat(jointMatrixAcc, jointMatrices, a, 2);
            bone->mOffsetMatrix.a4 = ReadFloat(jointMatrixAcc, jointMatrices, a, 3);
            bone->mOffsetMatrix.b1 = ReadFloat(jointMatrixAcc, jointMatrices, a, 4);
            bone->mOffsetMatrix.b2 = ReadFloat(jointMatrixAcc, jointMatrices, a, 5);
            bone->mOffsetMatrix.b3 = ReadFloat(jointMatrixAcc, jointMatrices, a, 6);
            bone->mOffsetMatrix.b4 = ReadFloat(jointMatrixAcc, jointMatrices, a, 7);
            bone->mOffsetMatrix.c1 = ReadFloat(jointMatrixAcc, jointMatrices, a, 8);
            bone->mOffsetMatrix.c2 = ReadFloat(jointMatrixAcc, jointMatrices, a, 9);
            bone->mOffsetMatrix.c3 = ReadFloat(jointMatrixAcc, jointMatrices, a, 10);
            bone->mOffsetMatrix.c4 = ReadFloat(jointMatrixAcc, jointMatrices, a, 11);
            bone->mNumWeights = static_cast<unsigned int>(dstBones[a].size());
            bone->mWeights = new aiVertexWeight[bone->mNumWeights];
            std::copy(dstBones[a].begin(), dstBones[a].end(), bone->mWeights);

            // apply bind shape matrix to offset matrix
            aiMatrix4x4 bindShapeMatrix;
            bindShapeMatrix.a1 = pSrcController->mBindShapeMatrix[0];
            bindShapeMatrix.a2 = pSrcController->mBindShapeMatrix[1];
            bindShapeMatrix.a3 = pSrcController->mBindShapeMatrix[2];
            bindShapeMatrix.a4 = pSrcController->mBindShapeMatrix[3];
            bindShapeMatrix.b1 = pSrcController->mBindShapeMatrix[4];
            bindShapeMatrix.b2 = pSrcController->mBindShapeMatrix[5];
            bindShapeMatrix.b3 = pSrcController->mBindShapeMatrix[6];
            bindShapeMatrix.b4 = pSrcController->mBindShapeMatrix[7];
            bindShapeMatrix.c1 = pSrcController->mBindShapeMatrix[8];
            bindShapeMatrix.c2 = pSrcController->mBindShapeMatrix[9];
            bindShapeMatrix.c3 = pSrcController->mBindShapeMatrix[10];
            bindShapeMatrix.c4 = pSrcController->mBindShapeMatrix[11];
            bindShapeMatrix.d1 = pSrcController->mBindShapeMatrix[12];
            bindShapeMatrix.d2 = pSrcController->mBindShapeMatrix[13];
            bindShapeMatrix.d3 = pSrcController->mBindShapeMatrix[14];
            bindShapeMatrix.d4 = pSrcController->mBindShapeMatrix[15];
            bone->mOffsetMatrix *= bindShapeMatrix;

            // HACK: (thom) Some exporters address the bone nodes by SID, others address them by ID or even name.
            // Therefore I added a little name replacement here: I search for the bone's node by either name, ID or SID,
            // and replace the bone's name by the node's name so that the user can use the standard
            // find-by-name method to associate nodes with bones.
            const Collada::Node* bnode = FindNode( pParser.mRootNode, bone->mName.data);
            if( !bnode) {
                bnode = FindNodeBySID( pParser.mRootNode, bone->mName.data);
            }

            // assign the name that we would have assigned for the source node
            if( bnode) {
                bone->mName.Set( FindNameForNode( bnode));
            } else {
                ASSIMP_LOG_WARN_F( "ColladaLoader::CreateMesh(): could not find corresponding node for joint \"", bone->mName.data, "\"." );
            }

            // and insert bone
            dstMesh->mBones[boneCount++] = bone;
        }
    }

    return dstMesh.release();
}